

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O1

idx_t __thiscall
duckdb::TemporaryMemoryManager::ComputeReservation
          (TemporaryMemoryManager *this,TemporaryMemoryState *temporary_memory_state)

{
  _Hash_node_base *p_Var1;
  TemporaryMemoryState *pTVar2;
  __int_type _Var3;
  value_type vVar4;
  pointer __first;
  pointer __last;
  size_type *psVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  long lVar9;
  idx_t iVar10;
  double *pdVar11;
  idx_t iVar12;
  InternalException *this_00;
  ulong uVar13;
  size_type sVar14;
  size_type __n;
  double dVar15;
  size_type __n_00;
  ulong uVar16;
  ulong uVar17;
  _Hash_node_base *p_Var18;
  pointer pcVar19;
  _Hash_node_base *p_Var20;
  double dVar21;
  size_type index;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  long lVar22;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  bool bVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<double,_true> der;
  vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true> states;
  vector<unsigned_long,_true> idxs;
  optional_idx state_index;
  vector<unsigned_long,_true> res;
  idx_t initial_reservation;
  vector<unsigned_long,_true> max_res;
  allocator_type local_131;
  size_type *local_130;
  vector<double,_std::allocator<double>_> local_128;
  ulong local_110;
  ulong local_108;
  size_type *local_100;
  value_type local_f8;
  vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  optional_idx local_b0;
  vector<unsigned_long,_true> local_a8;
  TemporaryMemoryManager *local_90;
  string local_88;
  size_type *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  double local_48;
  
  local_b0.index = 0xffffffffffffffff;
  index = 0;
  local_e8.
  super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
  .
  super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (reference_wrapper<const_duckdb::TemporaryMemoryState> *)0x0;
  local_e8.
  super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
  .
  super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
  .
  super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (reference_wrapper<const_duckdb::TemporaryMemoryState> *)0x0;
  local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  p_Var20 = (this->active_states)._M_h._M_before_begin._M_nxt;
  uVar13 = 0;
  local_90 = this;
  if (p_Var20 != (_Hash_node_base *)0x0) {
    uVar13 = 0;
    index = 0;
    do {
      p_Var1 = p_Var20[1]._M_nxt;
      p_Var18 = p_Var1[3]._M_nxt;
      if (p_Var1[3]._M_nxt < p_Var1[2]._M_nxt) {
        p_Var18 = p_Var1[2]._M_nxt;
      }
      if (p_Var1[1]._M_nxt <= p_Var18) {
        p_Var18 = p_Var1[1]._M_nxt;
      }
      pcVar19 = (pointer)((long)&p_Var18->_M_nxt + (ulong)(p_Var18 == (_Hash_node_base *)0x0));
      local_88._M_dataplus._M_p = pcVar19;
      if ((TemporaryMemoryState *)p_Var20[1]._M_nxt == temporary_memory_state) {
        optional_idx::optional_idx((optional_idx *)&local_c8,index);
        local_b0.index =
             (idx_t)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_017dfe02:
        if (local_e8.
            super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
            .
            super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_e8.
            super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
            .
            super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::reference_wrapper<duckdb::TemporaryMemoryState_const>,std::allocator<std::reference_wrapper<duckdb::TemporaryMemoryState_const>>>
          ::_M_realloc_insert<std::reference_wrapper<duckdb::TemporaryMemoryState>const&>
                    ((vector<std::reference_wrapper<duckdb::TemporaryMemoryState_const>,std::allocator<std::reference_wrapper<duckdb::TemporaryMemoryState_const>>>
                      *)&local_e8,
                     (iterator)
                     local_e8.
                     super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (reference_wrapper<duckdb::TemporaryMemoryState> *)(p_Var20 + 1));
        }
        else {
          (local_e8.
           super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
           .
           super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_data =
               ((reference_wrapper<duckdb::TemporaryMemoryState> *)(p_Var20 + 1))->_M_data;
          local_e8.
          super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
          .
          super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_e8.
               super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
               .
               super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                     (iterator)
                     local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(unsigned_long *)&local_88);
        }
        else {
          *local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_88._M_dataplus._M_p;
          local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (size_type *)0x7fefffffffffffff;
        if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_128,
                     (iterator)
                     local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_c8);
        }
        else {
          *local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = 1.79769313486232e+308;
          local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        index = index + 1;
      }
      else if (pcVar19 < (pointer)(((TemporaryMemoryState *)p_Var20[1]._M_nxt)->remaining_size).
                                  super___atomic_base<unsigned_long>._M_i) goto LAB_017dfe02;
      uVar13 = uVar13 + (long)pcVar19;
      p_Var20 = p_Var20->_M_nxt;
    } while (p_Var20 != (_Hash_node_base *)0x0);
  }
  local_110 = local_90->memory_limit - uVar13;
  if (local_90->memory_limit < uVar13 || local_110 == 0) {
    iVar10 = optional_idx::GetIndex(&local_b0);
    pdVar11 = (double *)vector<unsigned_long,_true>::operator[](&local_a8,iVar10);
    dVar15 = *pdVar11;
  }
  else {
    if (index != 0) {
      local_100 = (size_type *)(index * 5);
      local_68 = (size_type *)((long)local_100 + -1);
      local_130 = (size_type *)0x0;
      local_108 = local_110;
      do {
        ComputeDerivatives(&local_e8,&local_a8,(vector<double,_true> *)&local_128,index);
        __n_00 = 0;
        sVar14 = 0;
        local_f8 = 1.79769313486232e+308;
        do {
          pvVar6 = vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true>::
                   operator[](&local_e8,__n_00);
          pTVar2 = pvVar6->_M_data;
          pvVar7 = vector<unsigned_long,_true>::operator[](&local_a8,__n_00);
          if ((*pvVar7 < (pTVar2->remaining_size).super___atomic_base<unsigned_long>._M_i) &&
             (pvVar8 = vector<double,_true>::operator[]((vector<double,_true> *)&local_128,__n_00),
             *pvVar8 <= local_f8 && local_f8 != *pvVar8)) {
            pvVar8 = vector<double,_true>::operator[]((vector<double,_true> *)&local_128,__n_00);
            local_f8 = *pvVar8;
            sVar14 = __n_00;
          }
          __n_00 = __n_00 + 1;
        } while (index != __n_00);
        pvVar6 = vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true>::
                 operator[](&local_e8,sVar14);
        pTVar2 = pvVar6->_M_data;
        auVar26._8_4_ = (int)(local_108 >> 0x20);
        auVar26._0_8_ = local_108;
        auVar26._12_4_ = 0x45300000;
        lVar9 = (long)local_100 - (long)local_130;
        auVar27._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar27._0_8_ = lVar9;
        auVar27._12_4_ = 0x45300000;
        local_48 = ceil(((auVar26._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_108) - 4503599627370496.0)) /
                        ((auVar27._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)));
        local_f8 = local_48 - 9.223372036854776e+18;
        _Var3 = (pTVar2->remaining_size).super___atomic_base<unsigned_long>._M_i;
        pvVar7 = vector<unsigned_long,_true>::operator[](&local_a8,sVar14);
        vVar4 = *pvVar7;
        pvVar7 = vector<unsigned_long,_true>::operator[](&local_a8,sVar14);
        uVar17 = (long)local_f8 & (long)local_48 >> 0x3f | (long)local_48;
        uVar16 = _Var3 - vVar4;
        uVar13 = uVar16;
        if (uVar17 < uVar16) {
          uVar13 = uVar17;
        }
        *pvVar7 = *pvVar7 + uVar13;
        local_108 = local_108 - uVar13;
        local_130 = (size_type *)
                    ((long)local_130 + (ulong)(uVar17 <= uVar16 || local_130 != local_68));
      } while (local_130 < local_100);
    }
    local_88._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_c8,index,(value_type_conflict *)&local_88,(allocator_type *)&local_60);
    local_88._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_60,index,(value_type_conflict *)&local_88,&local_131);
    if (index != 0) {
      __n = 0;
      do {
        pvVar7 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)&local_c8,__n);
        *pvVar7 = __n;
        pvVar6 = vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true>::
                 operator[](&local_e8,__n);
        _Var3 = (pvVar6->_M_data->remaining_size).super___atomic_base<unsigned_long>._M_i;
        pvVar7 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)&local_60,__n);
        *pvVar7 = _Var3 - 1;
        __n = __n + 1;
      } while (index != __n);
    }
    ComputeDerivatives(&local_e8,(vector<unsigned_long,_true> *)&local_60,
                       (vector<double,_true> *)&local_128,index);
    __last = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __first = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar22 = (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar13 = lVar22 >> 3;
      lVar9 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TemporaryMemoryManager::ComputeReservation(duckdb::TemporaryMemoryState_const&)const::__0>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_storage_temporary_memory_manager_cpp:308:38)>
                  )&local_128);
      if (lVar22 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TemporaryMemoryManager::ComputeReservation(duckdb::TemporaryMemoryState_const&)const::__0>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_storage_temporary_memory_manager_cpp:308:38)>
                             )&local_128);
      }
      else {
        __last_00._M_current = __first + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TemporaryMemoryManager::ComputeReservation(duckdb::TemporaryMemoryState_const&)const::__0>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_storage_temporary_memory_manager_cpp:308:38)>
                    )&local_128);
        if (__last_00._M_current != __last) {
          do {
            ::std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::TemporaryMemoryManager::ComputeReservation(duckdb::TemporaryMemoryState_const&)const::__0>>
                      (__last_00,
                       (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_storage_temporary_memory_manager_cpp:308:38)>
                        )&local_128);
            __last_00._M_current = __last_00._M_current + 1;
          } while (__last_00._M_current != __last);
        }
      }
    }
    bVar23 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start ==
             local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_100 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    psVar5 = local_130;
    local_130 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    while (uVar13 = (ulong)bVar23, !bVar23) {
      uVar13 = local_108 >> 8;
      local_108 = CONCAT71((int7)uVar13,bVar23);
      sVar14 = *local_130;
      pvVar6 = vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true>::operator[]
                         (&local_e8,sVar14);
      pTVar2 = pvVar6->_M_data;
      uVar13 = (pTVar2->minimum_reservation).super___atomic_base<unsigned_long>._M_i;
      uVar16 = (pTVar2->reservation).super___atomic_base<unsigned_long>._M_i;
      if (uVar16 < uVar13) {
        uVar16 = uVar13;
      }
      uVar13 = (pTVar2->remaining_size).super___atomic_base<unsigned_long>._M_i;
      if (uVar13 <= uVar16) {
        uVar16 = uVar13;
      }
      dVar21 = (double)(uVar16 + (uVar16 == 0));
      uVar13 = local_90->num_connections;
      uVar16 = local_90->memory_limit;
      iVar10 = local_90->num_threads;
      pdVar11 = (double *)vector<unsigned_long,_true>::operator[](&local_a8,sVar14);
      dVar15 = *pdVar11;
      iVar12 = optional_idx::GetIndex(&local_b0);
      local_110 = local_110 + (long)dVar21;
      auVar24._8_4_ = (int)(local_110 >> 0x20);
      auVar24._0_8_ = local_110;
      auVar24._12_4_ = 0x45300000;
      dVar25 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_110) - 4503599627370496.0)) * 0.9;
      uVar17 = (ulong)dVar25;
      dVar25 = (double)((long)(dVar25 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
      if (0x1f < uVar13) {
        uVar13 = 0x20;
      }
      if (uVar13 < 9) {
        uVar13 = 8;
      }
      uVar17 = iVar10 << 0x1b;
      uVar16 = uVar16 >> 4;
      if (uVar17 < uVar16) {
        uVar16 = uVar17;
      }
      if (uVar16 * uVar13 <= (ulong)dVar25) {
        dVar25 = (double)(uVar16 * uVar13);
      }
      if ((ulong)dVar25 <= (ulong)dVar15) {
        dVar15 = dVar25;
      }
      if ((ulong)dVar15 <= (ulong)dVar21) {
        dVar15 = dVar21;
      }
      psVar5 = local_130;
      if (sVar14 == iVar12) {
        uVar13 = local_108 & 0xff;
        local_f8 = dVar15;
        break;
      }
      local_110 = local_110 - (long)dVar15;
      bVar23 = local_130 + 1 == local_100;
      local_130 = local_130 + 1;
    }
    local_130 = psVar5;
    dVar15 = local_f8;
    if ((uVar13 & 1) != 0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Did not find state_index in ComputeOptimalReservation","");
      InternalException::InternalException(this_00,&local_88);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (size_type *)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.
      super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super_vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_std::allocator<std::reference_wrapper<const_duckdb::TemporaryMemoryState>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (idx_t)dVar15;
}

Assistant:

void TemporaryMemoryState::SetRemainingSize(idx_t new_remaining_size) {
	auto guard = temporary_memory_manager.Lock();
	temporary_memory_manager.SetRemainingSize(*this, new_remaining_size);
}